

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVector<llvm::DWARFFormValue,_3U>::SmallVector
          (SmallVector<llvm::DWARFFormValue,_3U> *this,SmallVector<llvm::DWARFFormValue,_3U> *RHS)

{
  (this->super_SmallVectorImpl<llvm::DWARFFormValue>).
  super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
       &this->super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
  (this->super_SmallVectorImpl<llvm::DWARFFormValue>).
  super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
  (this->super_SmallVectorImpl<llvm::DWARFFormValue>).
  super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
  if ((RHS->super_SmallVectorImpl<llvm::DWARFFormValue>).
      super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
      super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size != 0) {
    SmallVectorImpl<llvm::DWARFFormValue>::operator=
              (&this->super_SmallVectorImpl<llvm::DWARFFormValue>,
               &RHS->super_SmallVectorImpl<llvm::DWARFFormValue>);
  }
  return;
}

Assistant:

SmallVector(SmallVector &&RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(::std::move(RHS));
  }